

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

anytype_t * ps_config_set(ps_config_t *config,char *name,anytype_t *val,ps_type_t t)

{
  anytype_t *paVar1;
  anytype_t *paVar2;
  char *fmt;
  int iVar3;
  long ln;
  ps_arg_t *ppVar4;
  
  if (val != (anytype_t *)0x0) {
    if ((t & ARG_STRING) != 0) {
      paVar2 = ps_config_set_str(config,name,(char *)val->ptr);
      return paVar2;
    }
    if ((t & ARG_INTEGER) == 0) {
      if ((t & ARG_BOOLEAN) == 0) {
        if ((t & ARG_FLOATING) == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                  ,0x28b,"Value has unknown type %d\n",name);
          return (anytype_t *)0x0;
        }
        iVar3 = (int)val->fl;
      }
      else {
        iVar3 = *(int *)val;
      }
      paVar2 = ps_config_set_bool(config,name,iVar3);
      return paVar2;
    }
    paVar2 = ps_config_set_int(config,name,val->i);
    return paVar2;
  }
  paVar2 = &cmd_ln_access_r(config,name)->val;
  if (paVar2 == (anytype_t *)0x0) {
    fmt = "Unknown parameter %s\n";
    ln = 0x269;
  }
  else {
    for (ppVar4 = config->defn; ppVar4->name != (char *)0x0; ppVar4 = ppVar4 + 1) {
      iVar3 = strcmp(ppVar4->name,name);
      if (iVar3 == 0) {
        paVar1 = anytype_from_str(paVar2,*(int *)(paVar2 + 1),ppVar4->deflt);
        if (paVar1 == (anytype_t *)0x0) {
          return (anytype_t *)0x0;
        }
        if (ppVar4->name != (char *)0x0) {
          return paVar2;
        }
        break;
      }
    }
    fmt = "No definition found for %s\n";
    ln = 0x275;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
          ,ln,fmt,name);
  return (anytype_t *)0x0;
}

Assistant:

const anytype_t *
ps_config_set(ps_config_t *config, const char *name, const anytype_t *val, ps_type_t t)
{
    if (val == NULL) {
        /* Restore default parameter */
        return ps_config_unset(config, name);
    }
    else if (t & ARG_STRING)
        return ps_config_set_str(config, name, val->ptr);
    else if (t & ARG_INTEGER)
        return ps_config_set_int(config, name, val->i);
    else if (t & ARG_BOOLEAN)
        return ps_config_set_bool(config, name, val->i);
    else if (t & ARG_FLOATING)
        return ps_config_set_bool(config, name, val->fl);
    else {
        E_ERROR("Value has unknown type %d\n", name, t);
        return NULL;
    }
}